

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O3

bool FinalizePSBT(PartiallySignedTransaction *psbtx)

{
  SigningProvider *provider;
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  PrecomputedTransactionData txdata;
  PrecomputedTransactionData local_160;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PrecomputePSBTData(&local_160,psbtx);
  provider = DUMMY_SIGNING_PROVIDER;
  if (*(pointer *)
       ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
               super__Optional_payload<CMutableTransaction,_true,_false,_false>.
               super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin + 8) ==
      *(pointer *)
       &(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin) {
    bVar3 = true;
  }
  else {
    uVar4 = 0;
    bVar3 = true;
    do {
      bVar1 = SignPSBTInput(provider,psbtx,(int)uVar4,&local_160,1,(SignatureData *)0x0,true);
      bVar3 = (bool)(bVar3 & bVar1);
      uVar4 = (ulong)((int)uVar4 + 1);
      uVar2 = ((long)*(pointer *)
                      ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                              _M_payload.
                              super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                              super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                              vin + 8) -
               *(long *)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                         _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>
                         .super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin
              >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_160.m_spent_outputs);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool FinalizePSBT(PartiallySignedTransaction& psbtx)
{
    // Finalize input signatures -- in case we have partial signatures that add up to a complete
    //   signature, but have not combined them yet (e.g. because the combiner that created this
    //   PartiallySignedTransaction did not understand them), this will combine them into a final
    //   script.
    bool complete = true;
    const PrecomputedTransactionData txdata = PrecomputePSBTData(psbtx);
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        complete &= SignPSBTInput(DUMMY_SIGNING_PROVIDER, psbtx, i, &txdata, SIGHASH_ALL, nullptr, true);
    }

    return complete;
}